

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall
ImGuiTextFilter::ImGuiTextRange::split
          (ImGuiTextRange *this,char separator,ImVector<ImGuiTextFilter::ImGuiTextRange> *out)

{
  ImVector<ImGuiTextFilter::ImGuiTextRange> *in_RDX;
  char in_SIL;
  undefined8 *in_RDI;
  char *we;
  char *wb;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *in_stack_ffffffffffffffa0;
  ImGuiTextRange local_48;
  ImGuiTextRange local_38;
  char *local_28;
  char *local_20;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *local_18;
  char local_9;
  
  local_18 = in_RDX;
  local_9 = in_SIL;
  ImVector<ImGuiTextFilter::ImGuiTextRange>::resize
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  local_28 = (char *)*in_RDI;
  local_20 = local_28;
  for (; local_28 < (char *)in_RDI[1]; local_28 = local_28 + 1) {
    if (*local_28 == local_9) {
      ImGuiTextRange(&local_38,local_20,local_28);
      ImVector<ImGuiTextFilter::ImGuiTextRange>::push_back
                (in_stack_ffffffffffffffa0,
                 (ImGuiTextRange *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_20 = local_28 + 1;
    }
  }
  if (local_20 != local_28) {
    ImGuiTextRange(&local_48,local_20,local_28);
    ImVector<ImGuiTextFilter::ImGuiTextRange>::push_back
              (local_18,(ImGuiTextRange *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  return;
}

Assistant:

void ImGuiTextFilter::ImGuiTextRange::split(char separator, ImVector<ImGuiTextRange>* out) const
{
    out->resize(0);
    const char* wb = b;
    const char* we = wb;
    while (we < e)
    {
        if (*we == separator)
        {
            out->push_back(ImGuiTextRange(wb, we));
            wb = we + 1;
        }
        we++;
    }
    if (wb != we)
        out->push_back(ImGuiTextRange(wb, we));
}